

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O0

void wasm::makeClampLimitLiterals<long,float>(Literal *iMin,Literal *fMin,Literal *fMax)

{
  Literal local_88;
  Literal local_70;
  Literal local_48;
  long local_30;
  long maxVal;
  long minVal;
  Literal *fMax_local;
  Literal *fMin_local;
  Literal *iMin_local;
  
  minVal = (long)fMax;
  fMax_local = fMin;
  fMin_local = iMin;
  maxVal = std::numeric_limits<long>::min();
  local_30 = std::numeric_limits<long>::max();
  Literal::Literal(&local_48,maxVal);
  Literal::operator=(fMin_local,&local_48);
  Literal::~Literal(&local_48);
  Literal::Literal(&local_70,(float)maxVal + -1.0);
  Literal::operator=(fMax_local,&local_70);
  Literal::~Literal(&local_70);
  Literal::Literal(&local_88,(float)local_30 + 1.0);
  Literal::operator=((Literal *)minVal,&local_88);
  Literal::~Literal(&local_88);
  return;
}

Assistant:

void makeClampLimitLiterals(Literal& iMin, Literal& fMin, Literal& fMax) {
  IntType minVal = std::numeric_limits<IntType>::min();
  IntType maxVal = std::numeric_limits<IntType>::max();
  iMin = Literal(minVal);
  fMin = Literal(FloatType(minVal) - 1);
  fMax = Literal(FloatType(maxVal) + 1);
}